

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

char * Ndr_ObjWriteConstant(uint *pBits,int nBits)

{
  size_t sVar1;
  int iVar2;
  
  if (nBits < 0x2706) {
    sprintf(Ndr_ObjWriteConstant::Buffer,"%d\'b",(ulong)(uint)nBits);
    sVar1 = strlen(Ndr_ObjWriteConstant::Buffer);
    if (0 < nBits) {
      sVar1 = (size_t)(int)sVar1;
      iVar2 = nBits + 1;
      do {
        Ndr_ObjWriteConstant::Buffer[sVar1] =
             (pBits[iVar2 - 2U >> 5] >> (iVar2 - 2U & 0x1f) & 1) != 0 | 0x30;
        sVar1 = sVar1 + 1;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    Ndr_ObjWriteConstant::Buffer[(int)sVar1] = '\0';
    return Ndr_ObjWriteConstant::Buffer;
  }
  __assert_fail("nBits + 10 < 10000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNdr.c"
                ,0xb6,"char *Ndr_ObjWriteConstant(unsigned int *, int)");
}

Assistant:

char * Ndr_ObjWriteConstant( unsigned * pBits, int nBits )
{
    static char Buffer[10000]; int i, Len;
    assert( nBits + 10 < 10000 );
    sprintf( Buffer, "%d\'b", nBits );
    Len = strlen(Buffer);
    for ( i = nBits-1; i >= 0; i-- )
        Buffer[Len++] = '0' + Abc_InfoHasBit(pBits, i);
    Buffer[Len] = 0;
    return Buffer;
}